

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O1

TokenType __thiscall
soul::Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
checkIntLiteralRange
          (Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
           *this,bool isNegative)

{
  char *__s1;
  long lVar1;
  int iVar2;
  CompileMessage local_58;
  
  __s1 = (this->literalType).text;
  if ((__s1 == "$integer32") ||
     ((__s1 != (char *)0x0 && (iVar2 = strcmp(__s1,"$integer32"), iVar2 == 0)))) {
    lVar1 = this->literalIntValue;
    if (isNegative) {
      if (0x80000000 < lVar1) {
        CompileMessageHelpers::createMessage<>
                  (&local_58,syntax,error,
                   "This value is too large to fit into an int32, did you mean to add an \'i64\' suffix?"
                  );
        (*this->_vptr_Tokeniser[2])(this,&local_58);
        RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_58.location.sourceCode.object);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58.description._M_dataplus._M_p != &local_58.description.field_2) {
          operator_delete(local_58.description._M_dataplus._M_p,
                          local_58.description.field_2._M_allocated_capacity + 1);
        }
      }
      if (isNegative) goto LAB_001d2367;
      lVar1 = this->literalIntValue;
    }
    if (0x7fffffff < lVar1) {
      CompileMessageHelpers::createMessage<>
                (&local_58,syntax,error,
                 "This value is too large to fit into an int32, did you mean to add an \'i64\' suffix?"
                );
      (*this->_vptr_Tokeniser[2])(this,&local_58);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_58.location.sourceCode.object);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.description._M_dataplus._M_p != &local_58.description.field_2) {
        operator_delete(local_58.description._M_dataplus._M_p,
                        local_58.description.field_2._M_allocated_capacity + 1);
      }
    }
  }
LAB_001d2367:
  return (TokenType)(this->literalType).text;
}

Assistant:

TokenType checkIntLiteralRange (bool isNegative)
    {
        if (literalType == Token::literalInt32)
        {
            if (isNegative && literalIntValue > -static_cast<int64_t> (std::numeric_limits<int32_t>::min()))
                throwError (Errors::integerLiteralNeedsSuffix());

            if (! isNegative && literalIntValue > static_cast<int64_t> (std::numeric_limits<int32_t>::max()))
                throwError (Errors::integerLiteralNeedsSuffix());
        }

        return literalType;
    }